

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void init_simple_motion_search_mvs(SIMPLE_MOTION_DATA_TREE *sms_tree,FULLPEL_MV *start_mvs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  while( true ) {
    uVar1 = *(undefined8 *)start_mvs;
    uVar2 = *(undefined8 *)(start_mvs + 2);
    uVar3 = *(undefined8 *)(start_mvs + 6);
    *(undefined8 *)(sms_tree->start_mvs + 4) = *(undefined8 *)(start_mvs + 4);
    *(undefined8 *)(sms_tree->start_mvs + 6) = uVar3;
    *(undefined8 *)sms_tree->start_mvs = uVar1;
    *(undefined8 *)(sms_tree->start_mvs + 2) = uVar2;
    sms_tree->sms_none_feat[0] = 0;
    sms_tree->sms_none_feat[1] = 0;
    sms_tree->sms_rect_feat[0] = 0;
    sms_tree->sms_rect_feat[1] = 0;
    sms_tree->sms_rect_feat[2] = 0;
    sms_tree->sms_rect_feat[3] = 0;
    sms_tree->sms_rect_feat[4] = 0;
    sms_tree->sms_rect_feat[5] = 0;
    sms_tree->sms_rect_feat[6] = 0;
    sms_tree->sms_rect_feat[7] = 0;
    sms_tree->sms_none_valid = 0;
    sms_tree->sms_rect_valid = 0;
    if (sms_tree->block_size < BLOCK_8X8) break;
    init_simple_motion_search_mvs(sms_tree->split[0],start_mvs);
    init_simple_motion_search_mvs(sms_tree->split[1],start_mvs);
    init_simple_motion_search_mvs(sms_tree->split[2],start_mvs);
    sms_tree = sms_tree->split[3];
  }
  return;
}

Assistant:

static inline void init_simple_motion_search_mvs(
    SIMPLE_MOTION_DATA_TREE *sms_tree, const FULLPEL_MV *start_mvs) {
  memcpy(sms_tree->start_mvs, start_mvs, sizeof(sms_tree->start_mvs));
  av1_zero(sms_tree->sms_none_feat);
  av1_zero(sms_tree->sms_rect_feat);
  av1_zero(sms_tree->sms_none_valid);
  av1_zero(sms_tree->sms_rect_valid);

  if (sms_tree->block_size >= BLOCK_8X8) {
    init_simple_motion_search_mvs(sms_tree->split[0], start_mvs);
    init_simple_motion_search_mvs(sms_tree->split[1], start_mvs);
    init_simple_motion_search_mvs(sms_tree->split[2], start_mvs);
    init_simple_motion_search_mvs(sms_tree->split[3], start_mvs);
  }
}